

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

char * decode_decimal(char *str,unsigned_long *v)

{
  int iVar1;
  ulong uStack_30;
  int c;
  unsigned_long acc;
  char *orig;
  unsigned_long *v_local;
  char *str_local;
  
  uStack_30 = 0;
  v_local = (unsigned_long *)str;
  while( true ) {
    iVar1 = (int)(char)*v_local;
    if ((iVar1 < 0x30) || (0x39 < iVar1)) {
      if ((v_local == (unsigned_long *)str) ||
         ((*str == '0' && (v_local != (unsigned_long *)(str + 1))))) {
        str_local = (char *)0x0;
      }
      else {
        *v = uStack_30;
        str_local = (char *)v_local;
      }
      return str_local;
    }
    if (0x1999999999999999 < uStack_30) {
      return (char *)0x0;
    }
    if (uStack_30 * -10 - 1 < (ulong)(long)(iVar1 + -0x30)) break;
    uStack_30 = (long)(iVar1 + -0x30) + uStack_30 * 10;
    v_local = (unsigned_long *)((long)v_local + 1);
  }
  return (char *)0x0;
}

Assistant:

static const char *decode_decimal(const char *str, unsigned long *v) {
    const char *orig;
    unsigned long acc;

    acc = 0;
    for (orig = str;; str++) {
        int c;

        c = *str;
        if (c < '0' || c > '9') {
            break;
        }
        c -= '0';
        if (acc > (ULONG_MAX / 10)) {
            return NULL;
        }
        acc *= 10;
        if ((unsigned long)c > (ULONG_MAX - acc)) {
            return NULL;
        }
        acc += (unsigned long)c;
    }
    if (str == orig || (*orig == '0' && str != (orig + 1))) {
        return NULL;
    }
    *v = acc;
    return str;
}